

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarInduction(Abc_Ntk_t *pNtk,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                       int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  long lVar3;
  long lVar4;
  char *format;
  int level;
  Aig_Man_t *pAVar5;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    iVar1 = -1;
  }
  else {
    pAVar5 = p;
    iVar1 = Saig_ManInduction(p,nTimeOut,nFramesMax,nConfMax,fUnique,fUniqueAll,fGetCex,fVerbose,
                              fVeryVerbose);
    iVar2 = (int)pAVar5;
    if (iVar1 == 0) {
      format = "Networks are NOT EQUIVALENT.   ";
    }
    else if (iVar1 == 1) {
      format = "Networks are equivalent.   ";
    }
    else {
      format = "Networks are UNDECIDED.   ";
    }
    Abc_Print(iVar2,format);
    Abc_Print(iVar2,"%s =","Time");
    level = 3;
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar4) / 1000000.0);
    if (fGetCex != 0) {
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
      }
      pNtk->pSeqModel = p->pSeqModel;
      p->pSeqModel = (Abc_Cex_t *)0x0;
    }
    Aig_ManStop(p);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarInduction( Abc_Ntk_t * pNtk, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{ 
    Aig_Man_t * pMan;
    abctime clkTotal = Abc_Clock();
    int RetValue;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return -1;
    RetValue = Saig_ManInduction( pMan, nTimeOut, nFramesMax, nConfMax, fUnique, fUniqueAll, fGetCex, fVerbose, fVeryVerbose );
    if ( RetValue == 1 )
    {
        Abc_Print( 1, "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        Abc_Print( 1, "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        Abc_Print( 1, "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    if ( fGetCex )
    {
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    Aig_ManStop( pMan );
    return RetValue;
}